

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

bool __thiscall Pig::getUntilWS(Pig *this,string *result)

{
  bool bVar1;
  element_type *peVar2;
  string local_78 [32];
  string local_58 [32];
  size_type local_38;
  size_type prev;
  size_type sStack_28;
  int c;
  size_type save;
  string *result_local;
  Pig *this_local;
  
  sStack_28 = this->_cursor;
  local_38 = this->_cursor;
  save = (size_type)result;
  result_local = (string *)this;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    prev._4_4_ = utf8_next_char(peVar2,&this->_cursor);
    if (prev._4_4_ == 0) {
      return sStack_28 < this->_cursor;
    }
    bVar1 = unicodeWhitespace(prev._4_4_);
    if (bVar1) break;
    bVar1 = eos(this);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_78,(ulong)peVar2);
      std::__cxx11::string::operator=((string *)save,local_78);
      std::__cxx11::string::~string(local_78);
      return true;
    }
    local_38 = this->_cursor;
  }
  this->_cursor = local_38;
  peVar2 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::substr((ulong)local_58,(ulong)peVar2);
  std::__cxx11::string::operator=((string *)save,local_58);
  std::__cxx11::string::~string(local_58);
  return true;
}

Assistant:

bool Pig::getUntilWS (std::string& result)
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (unicodeWhitespace (c))
    {
      _cursor = prev;
      result = _text->substr (save, _cursor - save);
      return true;
    }

    // Note: This test must follow the above unicodeWhitespace(c) test because
    //       it is testing the value of 'c', and eos() is testing _cursor,
    //       which has already been advanced.
    else if (eos ())
    {
      result = _text->substr (save, _cursor - save);
      return true;
    }

    prev = _cursor;
  }

  return _cursor > save;
}